

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> *
NpyArray::CreateHeaderNPY
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,shape_t *shape,char type,
          size_t wordSize)

{
  ulong uVar1;
  const_reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  iterator __first;
  iterator __last;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_100;
  const_iterator local_f8;
  undefined1 local_e9;
  char *local_e8;
  value_type local_d9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d8;
  const_iterator local_d0;
  size_type local_c8;
  size_t remainder;
  undefined1 local_b8 [7];
  char ver;
  ulong local_98;
  size_t i;
  string local_70;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> dict;
  size_t wordSize_local;
  char type_local;
  shape_t *shape_local;
  vector<char,_std::allocator<char>_> *header;
  
  dict.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = wordSize;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_40);
  add((vector<char,_std::allocator<char>_> *)local_40,"{\'descr\': \'");
  add<char>((vector<char,_std::allocator<char>_> *)local_40,'<');
  add<char>((vector<char,_std::allocator<char>_> *)local_40,type);
  std::__cxx11::to_string
            (&local_70,dict.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
  add((vector<char,_std::allocator<char>_> *)local_40,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  add((vector<char,_std::allocator<char>_> *)local_40,"\', \'fortran_order\': False, \'shape\': (");
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](shape,0);
  std::__cxx11::to_string((string *)&i,*pvVar2);
  add((vector<char,_std::allocator<char>_> *)local_40,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  for (local_98 = 1; uVar1 = local_98,
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(shape), uVar1 < sVar3
      ; local_98 = local_98 + 1) {
    add((vector<char,_std::allocator<char>_> *)local_40,", ");
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](shape,local_98);
    std::__cxx11::to_string((string *)local_b8,*pvVar2);
    add((vector<char,_std::allocator<char>_> *)local_40,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
  }
  add((vector<char,_std::allocator<char>_> *)local_40,"), }");
  remainder._7_1_ = '\x01';
  sVar3 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_40);
  local_c8 = 0x10 - (sVar3 + 10 & 0xf);
  sVar3 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_40);
  if (0xffff < sVar3 + local_c8) {
    remainder._7_1_ = '\x02';
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_40);
    local_c8 = 0x10 - (sVar3 + 0xc & 0xf);
  }
  local_d8._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)local_40);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_d0,
             &local_d8);
  local_d9 = ' ';
  local_e8 = (char *)std::vector<char,_std::allocator<char>_>::insert
                               ((vector<char,_std::allocator<char>_> *)local_40,local_d0,local_c8,
                                &local_d9);
  pvVar4 = std::vector<char,_std::allocator<char>_>::back
                     ((vector<char,_std::allocator<char>_> *)local_40);
  *pvVar4 = '\n';
  local_e9 = 0;
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__);
  add<char>(__return_storage_ptr__,-0x6d);
  add(__return_storage_ptr__,"NUMPY");
  add<char>(__return_storage_ptr__,remainder._7_1_);
  add<char>(__return_storage_ptr__,'\0');
  if (remainder._7_1_ == '\x01') {
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_40);
    add<unsigned_short>(__return_storage_ptr__,(unsigned_short)sVar3);
  }
  else {
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_40);
    add<unsigned_int>(__return_storage_ptr__,(uint)sVar3);
  }
  local_100._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end(__return_storage_ptr__);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_f8,
             &local_100);
  __first = std::vector<char,_std::allocator<char>_>::begin
                      ((vector<char,_std::allocator<char>_> *)local_40);
  __last = std::vector<char,_std::allocator<char>_>::end
                     ((vector<char,_std::allocator<char>_> *)local_40);
  std::vector<char,std::allocator<char>>::
  insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((vector<char,std::allocator<char>> *)__return_storage_ptr__,local_f8,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             __first._M_current,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)__last._M_current
            );
  local_e9 = 1;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> NpyArray::CreateHeaderNPY(const shape_t& shape, char type, size_t wordSize)
{
	std::vector<char> dict;
	add(dict, "{'descr': '");
	#if __BYTE_ORDER == __LITTLE_ENDIAN
	add(dict, '<');
	#else
	add(dict, '>');
	#endif
	add(dict, type);
	add(dict, std::to_string(wordSize));
	add(dict, "', 'fortran_order': False, 'shape': (");
	add(dict, std::to_string(shape[0]));
	for (size_t i = 1; i < shape.size(); i++) {
		add(dict, ", ");
		add(dict, std::to_string(shape[i]));
	}
	add(dict, "), }");
	// pad with spaces so that preamble+dict is modulo 16 bytes
	// preamble is 10/12 bytes and dict needs to end with \n
	char ver = 1;
	size_t remainder = 16 - (10 + dict.size()) % 16;
	if (dict.size() + remainder > 65535) {
		ver = 2;
		remainder = 16 - (12 + dict.size()) % 16;
	}
	dict.insert(dict.end(), remainder, ' ');
	dict.back() = '\n';

	std::vector<char> header;
	add(header, (char)0x93);
	add(header, "NUMPY");
	add(header, ver); // major version of numpy format
	add(header, (char)0); // minor version of numpy format
	if (ver == 1)
		add(header, (uint16_t)dict.size());
	else
		add(header, (uint32_t)dict.size());
	header.insert(header.end(), dict.begin(), dict.end());
	return header;
}